

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BibIndexer.cpp
# Opt level: O0

bool __thiscall
BibIndexer::getEntryKey
          (BibIndexer *this,u16string *keyName,TSNode *entryNode,uint32_t *index,uint32_t childCount
          )

{
  TSNode self;
  TSSymbol TVar1;
  TSTree *in_stack_fffffffffffffef8;
  allocator<char> local_d9;
  string local_d8;
  u16string local_b8;
  uint32_t local_98 [2];
  uint32_t auStack_90 [2];
  uint32_t local_88 [2];
  void *pvStack_80;
  undefined8 local_78;
  undefined8 uStack_70;
  void *local_68;
  TSTree *pTStack_60;
  undefined1 auStack_58 [8];
  TSNode node;
  uint32_t childCount_local;
  uint32_t *index_local;
  TSNode *entryNode_local;
  u16string *keyName_local;
  BibIndexer *this_local;
  
  node.tree._4_4_ = childCount;
  while( true ) {
    if (node.tree._4_4_ <= *index) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_d8,"Missign key name",&local_d9);
      addError(this,entryNode,MissingKeyName,&local_d8);
      std::__cxx11::string::~string((string *)&local_d8);
      std::allocator<char>::~allocator(&local_d9);
      return false;
    }
    local_78 = *(undefined8 *)entryNode->context;
    uStack_70 = *(undefined8 *)(entryNode->context + 2);
    local_68 = entryNode->id;
    pTStack_60 = entryNode->tree;
    ts_node_named_child((TSNode *)auStack_58,*entryNode,*index);
    local_88[0] = node.context[2];
    local_88[1] = node.context[3];
    pvStack_80 = node.id;
    local_98[0] = auStack_58._0_4_;
    local_98[1] = auStack_58._4_4_;
    auStack_90[0] = node.context[0];
    auStack_90[1] = node.context[1];
    self.context[2] = node.context[2];
    self.context[3] = node.context[3];
    self.context[0] = node.context[0];
    self.context[1] = node.context[1];
    self.id = node.id;
    self.tree = in_stack_fffffffffffffef8;
    TVar1 = ts_node_symbol(self);
    if (TVar1 == 0x1f) break;
    *index = *index + 1;
  }
  File::textForNode_abi_cxx11_(&local_b8,this->file,(TSNode *)auStack_58);
  std::__cxx11::basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>::
  operator=(keyName,&local_b8);
  std::__cxx11::u16string::~u16string((u16string *)&local_b8);
  return true;
}

Assistant:

bool BibIndexer::getEntryKey (u16string &keyName, TSNode &entryNode, uint32_t &index, uint32_t childCount) {
    for (; index < childCount; index++) {
        TSNode node = ts_node_named_child(entryNode, index);
        switch (ts_node_symbol(node)) {
            case SymKey:
                keyName = file->textForNode(node);
                return true;
            default: {}
        }
    }

    addError(entryNode, Error::MissingKeyName, "Missign key name");
    return false;
}